

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

void __thiscall IDisk::CreateSingleTrackFromMultiRevolutions(IDisk *this,int side,int track)

{
  Revolution *pRVar1;
  void *pvVar2;
  int iVar3;
  MFMTrack *pMVar4;
  uchar *__s;
  long lVar5;
  long lVar6;
  uint rev;
  ulong uVar7;
  MFMTrack **ppMVar8;
  Track track_buffer;
  
  ppMVar8 = &this->side_[side].tracks;
  if ((*ppMVar8)[track].nb_revolutions == 1) {
    pMVar4 = *ppMVar8 + track;
    pRVar1 = pMVar4->revolution;
    pMVar4->bitfield = pRVar1->bitfield;
    pMVar4->size = pRVar1->size;
    lVar5 = *(long *)&pRVar1[-1].track_info.full_size_;
    if (lVar5 != 0) {
      lVar6 = lVar5 * 0x30;
      do {
        std::_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>::~_Vector_base
                  ((_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)
                   ((long)pRVar1 + lVar6 + -0x20));
        lVar6 = lVar6 + -0x30;
      } while (lVar6 != 0);
    }
    operator_delete__(&pRVar1[-1].track_info.full_size_,lVar5 * 0x30 | 8);
    pMVar4 = *ppMVar8;
    pMVar4[track].nb_revolutions = 0;
    pMVar4[track].revolution = (Revolution *)0x0;
  }
  else {
    track_buffer.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    track_buffer.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    track_buffer.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = (*this->_vptr_IDisk[0x15])();
    lVar5 = 0;
    uVar7 = 0;
    if ((char)iVar3 == '\0') {
      while( true ) {
        pMVar4 = *ppMVar8;
        pRVar1 = pMVar4[track].revolution;
        if (pMVar4[track].nb_revolutions <= uVar7) break;
        pvVar2 = *(void **)((long)&pRVar1->bitfield + lVar5);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x30;
      }
      if (pRVar1 != (Revolution *)0x0) {
        lVar5 = *(long *)&pRVar1[-1].track_info.full_size_;
        if (lVar5 != 0) {
          lVar6 = lVar5 * 0x30;
          do {
            std::_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>::~_Vector_base
                      ((_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)
                       ((long)pRVar1 + lVar6 + -0x20));
            lVar6 = lVar6 + -0x30;
          } while (lVar6 != 0);
        }
        operator_delete__(&pRVar1[-1].track_info.full_size_,lVar5 * 0x30 | 8);
        pMVar4 = *ppMVar8;
      }
      pMVar4[track].revolution = (Revolution *)0x0;
      pMVar4[track].nb_revolutions = 0;
      pMVar4[track].bitfield = (uchar *)0x0;
      pMVar4[track].size = 0;
    }
    else {
      while( true ) {
        pMVar4 = *ppMVar8;
        pRVar1 = pMVar4[track].revolution;
        if (pMVar4[track].nb_revolutions <= uVar7) break;
        pvVar2 = *(void **)((long)&pRVar1->bitfield + lVar5);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x30;
      }
      if (pRVar1 != (Revolution *)0x0) {
        lVar5 = *(long *)&pRVar1[-1].track_info.full_size_;
        if (lVar5 != 0) {
          lVar6 = lVar5 * 0x30;
          do {
            std::_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>::~_Vector_base
                      ((_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)
                       ((long)pRVar1 + lVar6 + -0x20));
            lVar6 = lVar6 + -0x30;
          } while (lVar6 != 0);
        }
        operator_delete__(&pRVar1[-1].track_info.full_size_,lVar5 * 0x30 | 8);
        pMVar4 = *ppMVar8;
      }
      pMVar4[track].nb_revolutions = 0;
      pMVar4[track].revolution = (Revolution *)0x0;
    }
    std::_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>::~_Vector_base
              ((_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)&track_buffer);
    pMVar4 = *ppMVar8;
  }
  if (pMVar4[track].bitfield == (uchar *)0x0) {
    pMVar4[track].size = 0x40000;
    __s = (uchar *)operator_new__(0x40000);
    pMVar4[track].bitfield = __s;
    memset(__s,4,0x40000);
  }
  return;
}

Assistant:

void IDisk::CreateSingleTrackFromMultiRevolutions(int side, int track)
{
   // Only one revolution : Nothing else to add...
   if (side_[side].tracks[track].nb_revolutions == 1)
   {
      side_[side].tracks[track].bitfield = side_[side].tracks[track].revolution[0].bitfield;
      side_[side].tracks[track].size = side_[side].tracks[track].revolution[0].size;

      delete[]side_[side].tracks[track].revolution;
      side_[side].tracks[track].nb_revolutions = 0;
      side_[side].tracks[track].revolution = nullptr;
   }
   else
   {
      // Otherwise
      Track track_buffer;

      if (!CreateTrackFromRevolution(side, track))
      {
         for (unsigned int rev = 0; rev < side_[side].tracks[track].nb_revolutions; rev++)
         {
            delete[]side_[side].tracks[track].revolution[rev].bitfield;
         }
         delete[]side_[side].tracks[track].revolution;
         side_[side].tracks[track].revolution = nullptr;
         side_[side].tracks[track].nb_revolutions = 0;
         side_[side].tracks[track].bitfield = nullptr;
         side_[side].tracks[track].size = 0;
      }
      else
      {
         for (unsigned int rev = 0; rev < side_[side].tracks[track].nb_revolutions; rev++)
         {
            delete[]side_[side].tracks[track].revolution[rev].bitfield;
         }
         delete[]side_[side].tracks[track].revolution;
         side_[side].tracks[track].nb_revolutions = 0;
         side_[side].tracks[track].revolution = nullptr;
      }
   }
   // Now, just clear the Revolution structure.
   if (side_[side].tracks[track].bitfield == nullptr)
   {
      // Set a default (unformatted) track
      side_[side].tracks[track].size = DEFAULT_TRACK_SIZE * 16;
      side_[side].tracks[track].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
      memset(side_[side].tracks[track].bitfield, BIT_WEAK, DEFAULT_TRACK_SIZE * 16);
   }
}